

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_test.cpp
# Opt level: O3

void __thiscall
FloatingPoint_NextUpDownFloat_Test::TestBody(FloatingPoint_NextUpDownFloat_Test *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  float fVar4;
  byte bVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  AssertionResult gtest_ar;
  Message local_70;
  AssertHelper local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined2 local_4a;
  undefined1 local_48 [16];
  
  local_70.ss_.ptr_._0_4_ = 1.4013e-45;
  local_68.data_._0_4_ = 0;
  testing::internal::CmpHelperGT<float,float>
            (local_60,"NextFloatUp(-0.f)","0.f",(float *)&local_70,(float *)&local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x2e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ss_.ptr_._0_4_ = -1.4013e-45;
  local_68.data_._0_4_ = 0;
  testing::internal::CmpHelperLT<float,float>
            (local_60,"NextFloatDown(0.f)","0.f",(float *)&local_70,(float *)&local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x2f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ss_.ptr_._0_4_ = INFINITY;
  local_68.data_._0_4_ = 0x7f800000;
  testing::internal::CmpHelperEQ<float,float>
            (local_60,"NextFloatUp((float)Infinity)","(float)Infinity",(float *)&local_70,
             (float *)&local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x31,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ss_.ptr_._0_4_ = 3.4028235e+38;
  local_68.data_._0_4_ = 0x7f800000;
  testing::internal::CmpHelperLT<float,float>
            (local_60,"NextFloatDown((float)Infinity)","(float)Infinity",(float *)&local_70,
             (float *)&local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x32,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ss_.ptr_._0_4_ = -INFINITY;
  local_68.data_._0_4_ = 0xff800000;
  testing::internal::CmpHelperEQ<float,float>
            (local_60,"NextFloatDown(-(float)Infinity)","-(float)Infinity",(float *)&local_70,
             (float *)&local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x34,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ss_.ptr_._0_4_ = -3.4028235e+38;
  local_68.data_._0_4_ = -0x800000;
  testing::internal::CmpHelperGT<float,float>
            (local_60,"NextFloatUp(-(float)Infinity)","-(float)Infinity",(float *)&local_70,
             (float *)&local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x35,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  iVar7 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar8 = 0x853c49e6748fea9b;
  do {
    do {
      uVar3 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
      bVar5 = (byte)(uVar8 >> 0x3b);
      fVar4 = (float)(uVar3 >> bVar5 | uVar3 << 0x20 - bVar5);
      uVar8 = uVar8 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    } while (NAN(fVar4));
    local_48 = ZEXT416((uint)fVar4);
    if (ABS(fVar4) != INFINITY) {
      local_70.ss_.ptr_._0_4_ = nextafterf(fVar4,INFINITY);
      uVar1 = vcmpss_avx512f(local_48,ZEXT816(0) << 0x40,0);
      fVar4 = (float)((uint)!SUB81(uVar1 & 1,0) * local_48._0_4_);
      local_4a = (undefined2)(uVar1 & 1);
      local_68.data_._0_4_ = (-(uint)(fVar4 < 0.0) | 1) + (int)fVar4;
      testing::internal::CmpHelperEQ<float,float>
                (local_60,"std::nextafter(f, (float)Infinity)","NextFloatUp(f)",(float *)&local_70,
                 (float *)&local_68);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message(&local_70);
        pcVar6 = "";
        if (local_58.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
                   ,0x3d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_68,&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_70.ss_.ptr_._0_4_ = nextafterf((float)local_48._0_4_,-INFINITY);
      fVar4 = (float)((uint)((byte)local_4a & 1) * -0x80000000 +
                     (uint)!(bool)((byte)local_4a & 1) * local_48._0_4_);
      local_68.data_._0_4_ = (int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2;
      testing::internal::CmpHelperEQ<float,float>
                (local_60,"std::nextafter(f, -(float)Infinity)","NextFloatDown(f)",
                 (float *)&local_70,(float *)&local_68);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message(&local_70);
        pcVar6 = "";
        if (local_58.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
                   ,0x3e,pcVar6);
        testing::internal::AssertHelper::operator=(&local_68,&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 100000);
  return;
}

Assistant:

TEST(FloatingPoint, NextUpDownFloat) {
    EXPECT_GT(NextFloatUp(-0.f), 0.f);
    EXPECT_LT(NextFloatDown(0.f), 0.f);

    EXPECT_EQ(NextFloatUp((float)Infinity), (float)Infinity);
    EXPECT_LT(NextFloatDown((float)Infinity), (float)Infinity);

    EXPECT_EQ(NextFloatDown(-(float)Infinity), -(float)Infinity);
    EXPECT_GT(NextFloatUp(-(float)Infinity), -(float)Infinity);

    RNG rng;
    for (int i = 0; i < 100000; ++i) {
        float f = GetFloat(rng);
        if (std::isinf(f))
            continue;

        EXPECT_EQ(std::nextafter(f, (float)Infinity), NextFloatUp(f));
        EXPECT_EQ(std::nextafter(f, -(float)Infinity), NextFloatDown(f));
    }
}